

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O3

void decaf_448_point_add(decaf_448_point_s *p,decaf_448_point_s *q,decaf_448_point_s *r)

{
  gf_448_s *cs;
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint64x2_t *aa;
  gf_448_t c;
  gf_448_t b;
  gf_448_t a;
  gf_448_t d;
  gf_448_s local_160;
  gf_448_s local_120;
  gf_448_s local_e0;
  gf_448_s local_a0;
  
  lVar5 = 0;
  do {
    plVar2 = (long *)((long)q->y[0].limb + lVar5);
    lVar3 = plVar2[1];
    plVar1 = (long *)((long)q->x[0].limb + lVar5);
    lVar4 = plVar1[1];
    *(long *)((long)local_120.limb + lVar5) = *plVar2 - *plVar1;
    *(long *)((long)local_120.limb + lVar5 + 8) = lVar3 - lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_120.limb[0] = local_120.limb[0] + 0x1fffffffffffffe;
  local_120.limb[1] = local_120.limb[1] + 0x1fffffffffffffe;
  local_120.limb[2] = local_120.limb[2] + 0x1fffffffffffffe;
  local_120.limb[3] = local_120.limb[3] + 0x1fffffffffffffe;
  local_120.limb[4] = local_120.limb[4] + 0x1fffffffffffffc;
  local_120.limb[5] = local_120.limb[5] + 0x1fffffffffffffe;
  local_120.limb[6] = local_120.limb[6] + 0x1fffffffffffffe;
  local_120.limb[7] = local_120.limb[7] + 0x1fffffffffffffe;
  lVar5 = 0;
  do {
    plVar2 = (long *)((long)r->y[0].limb + lVar5);
    lVar3 = plVar2[1];
    plVar1 = (long *)((long)r->x[0].limb + lVar5);
    lVar4 = plVar1[1];
    *(long *)((long)local_160.limb + lVar5) = *plVar2 - *plVar1;
    *(long *)((long)local_160.limb + lVar5 + 8) = lVar3 - lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_160.limb[0] = local_160.limb[0] + 0x1fffffffffffffe;
  local_160.limb[1] = local_160.limb[1] + 0x1fffffffffffffe;
  local_160.limb[2] = local_160.limb[2] + 0x1fffffffffffffe;
  local_160.limb[3] = local_160.limb[3] + 0x1fffffffffffffe;
  local_160.limb[4] = local_160.limb[4] + 0x1fffffffffffffc;
  local_160.limb[5] = local_160.limb[5] + 0x1fffffffffffffe;
  local_160.limb[6] = local_160.limb[6] + 0x1fffffffffffffe;
  local_160.limb[7] = local_160.limb[7] + 0x1fffffffffffffe;
  lVar5 = 0;
  do {
    plVar1 = (long *)((long)r->x[0].limb + lVar5);
    lVar3 = plVar1[1];
    plVar2 = (long *)((long)r->y[0].limb + lVar5);
    lVar4 = plVar2[1];
    *(long *)((long)local_a0.limb + lVar5) = *plVar1 + *plVar2;
    *(long *)((long)local_a0.limb + lVar5 + 8) = lVar3 + lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  gf_448_mul(&local_e0,&local_160,&local_120);
  lVar5 = 0;
  do {
    plVar1 = (long *)((long)q->x[0].limb + lVar5);
    lVar3 = plVar1[1];
    plVar2 = (long *)((long)q->y[0].limb + lVar5);
    lVar4 = plVar2[1];
    *(long *)((long)local_120.limb + lVar5) = *plVar1 + *plVar2;
    *(long *)((long)local_120.limb + lVar5 + 8) = lVar3 + lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  cs = p->y;
  gf_448_mul(cs,&local_a0,&local_120);
  gf_448_mul(&local_120,r->t,q->t);
  gf_448_mulw_unsigned(p->x,&local_120,0x13154);
  lVar5 = 0;
  do {
    plVar1 = (long *)((long)p->y[0].limb + lVar5);
    lVar3 = plVar1[1];
    lVar4 = *(long *)((long)local_e0.limb + lVar5 + 8);
    *(long *)((long)local_120.limb + lVar5) = *plVar1 + *(long *)((long)local_e0.limb + lVar5);
    *(long *)((long)local_120.limb + lVar5 + 8) = lVar3 + lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    plVar1 = (long *)((long)p->y[0].limb + lVar5);
    lVar3 = plVar1[1];
    lVar4 = *(long *)((long)local_e0.limb + lVar5 + 8);
    *(long *)((long)local_160.limb + lVar5) = *plVar1 - *(long *)((long)local_e0.limb + lVar5);
    *(long *)((long)local_160.limb + lVar5 + 8) = lVar3 - lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_160.limb[0] = local_160.limb[0] + 0x1fffffffffffffe;
  local_160.limb[1] = local_160.limb[1] + 0x1fffffffffffffe;
  local_160.limb[2] = local_160.limb[2] + 0x1fffffffffffffe;
  local_160.limb[3] = local_160.limb[3] + 0x1fffffffffffffe;
  local_160.limb[4] = local_160.limb[4] + 0x1fffffffffffffc;
  local_160.limb[5] = local_160.limb[5] + 0x1fffffffffffffe;
  local_160.limb[6] = local_160.limb[6] + 0x1fffffffffffffe;
  local_160.limb[7] = local_160.limb[7] + 0x1fffffffffffffe;
  gf_448_mul(&local_e0,q->z,r->z);
  lVar5 = 0;
  do {
    lVar3 = *(long *)((long)local_e0.limb + lVar5 + 8);
    *(long *)((long)local_e0.limb + lVar5) = *(long *)((long)local_e0.limb + lVar5) * 2;
    *(long *)((long)local_e0.limb + lVar5 + 8) = lVar3 * 2;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    plVar1 = (long *)((long)p->x[0].limb + lVar5);
    lVar3 = plVar1[1];
    lVar4 = *(long *)((long)local_e0.limb + lVar5 + 8);
    plVar2 = (long *)((long)p->y[0].limb + lVar5);
    *plVar2 = *plVar1 + *(long *)((long)local_e0.limb + lVar5);
    plVar2[1] = lVar3 + lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    lVar3 = *(long *)((long)local_e0.limb + lVar5 + 8);
    plVar1 = (long *)((long)p->x[0].limb + lVar5);
    lVar4 = plVar1[1];
    *(long *)((long)local_e0.limb + lVar5) = *(long *)((long)local_e0.limb + lVar5) - *plVar1;
    *(long *)((long)local_e0.limb + lVar5 + 8) = lVar3 - lVar4;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_e0.limb[0] = local_e0.limb[0] + 0x1fffffffffffffe;
  local_e0.limb[1] = local_e0.limb[1] + 0x1fffffffffffffe;
  local_e0.limb[2] = local_e0.limb[2] + 0x1fffffffffffffe;
  local_e0.limb[3] = local_e0.limb[3] + 0x1fffffffffffffe;
  local_e0.limb[4] = local_e0.limb[4] + 0x1fffffffffffffc;
  local_e0.limb[5] = local_e0.limb[5] + 0x1fffffffffffffe;
  local_e0.limb[6] = local_e0.limb[6] + 0x1fffffffffffffe;
  local_e0.limb[7] = local_e0.limb[7] + 0x1fffffffffffffe;
  gf_448_mul(p->z,&local_e0,cs);
  gf_448_mul(p->x,cs,&local_160);
  gf_448_mul(cs,&local_e0,&local_120);
  gf_448_mul(p->t,&local_120,&local_160);
  return;
}

Assistant:

void API_NS(point_add) (
    point_t p,
    const point_t q,
    const point_t r
) {
    gf a, b, c, d;
    gf_sub_nr ( b, q->y, q->x ); /* 3+e */
    gf_sub_nr ( c, r->y, r->x ); /* 3+e */
    gf_add_nr ( d, r->y, r->x ); /* 2+e */
    gf_mul ( a, c, b );
    gf_add_nr ( b, q->y, q->x ); /* 2+e */
    gf_mul ( p->y, d, b );
    gf_mul ( b, r->t, q->t );
    gf_mulw ( p->x, b, 2*EFF_D );
    gf_add_nr ( b, a, p->y );    /* 2+e */
    gf_sub_nr ( c, p->y, a );    /* 3+e */
    gf_mul ( a, q->z, r->z );
    gf_add_nr ( a, a, a );       /* 2+e */
    if (GF_HEADROOM <= 3) gf_weak_reduce(a); /* or 1+e */
#if NEG_D
    gf_add_nr ( p->y, a, p->x ); /* 3+e or 2+e */
    gf_sub_nr ( a, a, p->x );    /* 4+e or 3+e */
#else
    gf_sub_nr ( p->y, a, p->x ); /* 4+e or 3+e */
    gf_add_nr ( a, a, p->x );    /* 3+e or 2+e */
#endif
    gf_mul ( p->z, a, p->y );
    gf_mul ( p->x, p->y, c );
    gf_mul ( p->y, a, b );
    gf_mul ( p->t, b, c );
}